

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

bool __thiscall
perfetto::protos::gen::EnumValueDescriptorProto::operator==
          (EnumValueDescriptorProto *this,EnumValueDescriptorProto *other)

{
  __type_conflict4 _Var1;
  
  _Var1 = ::std::operator==(&this->unknown_fields_,&other->unknown_fields_);
  if ((_Var1) && (_Var1 = ::std::operator==(&this->name_,&other->name_), _Var1)) {
    return this->number_ == other->number_;
  }
  return false;
}

Assistant:

bool EnumValueDescriptorProto::operator==(const EnumValueDescriptorProto& other) const {
  return unknown_fields_ == other.unknown_fields_
   && name_ == other.name_
   && number_ == other.number_;
}